

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

void mergesort_cache2_lcp_2way(uchar **strings,size_t n)

{
  size_t n_local;
  uchar **strings_local;
  
  mergesort_cache_lcp_2way<unsigned_short>(strings,n);
  return;
}

Assistant:

void mergesort_cache2_lcp_2way(unsigned char** strings, size_t n)
{ mergesort_cache_lcp_2way<uint16_t>(strings, n); }